

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffphtb(fitsfile *fptr,LONGLONG naxis1,LONGLONG naxis2,int tfields,char **ttype,long *tbcol,
          char **tform,char **tunit,char *extnmx,int *status)

{
  ulong uVar1;
  FITSfile *pFVar2;
  char *__s;
  char **ppcVar3;
  long extraout_RDX;
  long lVar4;
  undefined8 extraout_RDX_00;
  size_t sVar5;
  uint value;
  int iVar6;
  ulong uVar7;
  char extnm [71];
  char tfmt [30];
  char comm [73];
  char name [75];
  LONGLONG local_168;
  undefined4 local_15c;
  char **local_158;
  ulong local_150;
  char local_148 [80];
  char local_f8 [32];
  char local_d8 [80];
  char local_88 [88];
  
  local_158 = ttype;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar6 = *status;
  if (iVar6 < 1) {
    pFVar2 = fptr->Fptr;
    lVar4 = pFVar2->headend;
    if (lVar4 == pFVar2->headstart[pFVar2->curhdu]) {
      if (naxis1 < 0) {
        *status = 0xd9;
        iVar6 = 0xd9;
      }
      else if (naxis2 < 0) {
        *status = 0xda;
        iVar6 = 0xda;
      }
      else if ((uint)tfields < 1000) {
        local_148[0] = '\0';
        if (extnmx != (char *)0x0) {
          strncat(local_148,extnmx,0x46);
          lVar4 = extraout_RDX;
        }
        local_168 = naxis1;
        if (((tbcol == (long *)0x0) || (*tbcol == 0)) ||
           (local_15c = (undefined4)CONCAT71((int7)((ulong)lVar4 >> 8),1),
           tfields != 0 && naxis1 == 0)) {
          sVar5 = 5;
          if (5 < (uint)tfields) {
            sVar5 = (size_t)(uint)tfields;
          }
          tbcol = (long *)calloc(sVar5,8);
          if (tbcol == (long *)0x0) {
            local_15c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
            tbcol = (long *)0x0;
          }
          else {
            ffgabc(tfields,tform,1,&local_168,tbcol,status);
            local_15c = 0;
          }
        }
        ffpkys(fptr,"XTENSION","TABLE","ASCII table extension",status);
        ffpkyj(fptr,"BITPIX",8,"8-bit ASCII characters",status);
        ffpkyj(fptr,"NAXIS",2,"2-dimensional ASCII table",status);
        ffpkyj(fptr,"NAXIS1",local_168,"width of table in characters",status);
        ffpkyj(fptr,"NAXIS2",naxis2,"number of rows in table",status);
        ffpkyj(fptr,"PCOUNT",0,"no group parameters (required keyword)",status);
        ffpkyj(fptr,"GCOUNT",1,"one data group (required keyword)",status);
        local_150 = (ulong)(uint)tfields;
        ffpkyj(fptr,"TFIELDS",local_150,"number of fields in each row",status);
        uVar7 = 0;
        do {
          ppcVar3 = local_158;
          if (local_150 == uVar7) break;
          if (*local_158[uVar7] != '\0') {
            value = (int)uVar7 + 1;
            snprintf(local_d8,0x49,"label for field %3d",(ulong)value);
            ffkeyn("TTYPE",value,local_88,status);
            ffpkys(fptr,local_88,ppcVar3[uVar7],local_d8,status);
          }
          if ((tbcol[uVar7] < 1) || (local_168 < tbcol[uVar7])) {
            *status = 0xea;
          }
          uVar1 = uVar7 + 1;
          iVar6 = (int)uVar1;
          snprintf(local_d8,0x49,"beginning column of field %3d",uVar1 & 0xffffffff);
          ffkeyn("TBCOL",iVar6,local_88,status);
          ffpkyj(fptr,local_88,tbcol[uVar7],local_d8,status);
          __s = tform[uVar7];
          sVar5 = strlen(__s);
          if (0x1d < sVar5) {
            ffpmsg("Error: ASCII table TFORM code is too long (ffphtb)");
            *status = 0x105;
            break;
          }
          strcpy(local_f8,__s);
          ffupch(local_f8);
          ffkeyn("TFORM",iVar6,local_88,status);
          ffpkys(fptr,local_88,local_f8,"Fortran-77 format of field",status);
          if (((tunit != (char **)0x0) && (tunit[uVar7] != (char *)0x0)) && (*tunit[uVar7] != '\0'))
          {
            ffkeyn("TUNIT",iVar6,local_88,status);
            ffpkys(fptr,local_88,tunit[uVar7],"physical unit of field",status);
          }
          uVar7 = uVar1;
        } while (*status < 1);
        if (local_148[0] != '\0') {
          ffpkys(fptr,"EXTNAME",local_148,"name of this ASCII table extension",status);
        }
        if (0 < *status) {
          ffpmsg("Failed to write ASCII table header keywords (ffphtb)");
        }
        if ((char)local_15c == '\0') {
          free(tbcol);
        }
        iVar6 = *status;
      }
      else {
        *status = 0xd8;
        iVar6 = 0xd8;
      }
    }
    else {
      *status = 0xc9;
      iVar6 = 0xc9;
    }
  }
  return iVar6;
}

Assistant:

int ffphtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis1,     /* I - width of row in the table                */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           long *tbcol,     /* I - byte offset in row to each column        */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the ASCII TaBle:
*/
{
    int ii, ncols, gotmem = 0;
    long rowlen; /* must be 'long' because it is passed to ffgabc */
    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis1 < 0)
        return(*status = NEG_WIDTH);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);
    
    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    rowlen = (long) naxis1;

    if (!tbcol || !tbcol[0] || (!naxis1 && tfields)) /* spacing not defined? */
    {
      /* allocate mem for tbcol; malloc can have problems allocating small */
      /* arrays, so allocate at least 20 bytes */

      ncols = maxvalue(5, tfields);
      tbcol = (long *) calloc(ncols, sizeof(long));

      if (tbcol)
      {
        gotmem = 1;

        /* calculate width of a row and starting position of each column. */
        /* Each column will be separated by 1 blank space */
        ffgabc(tfields, tform, 1, &rowlen, tbcol, status);
      }
    }
    ffpkys(fptr, "XTENSION", "TABLE", "ASCII table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit ASCII characters", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional ASCII table", status);
    ffpkyj(fptr, "NAXIS1", rowlen, "width of table in characters", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);
    ffpkyj(fptr, "PCOUNT", 0, "no group parameters (required keyword)", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (tbcol[ii] < 1 || tbcol[ii] > rowlen)
           *status = BAD_TBCOL;

        snprintf(comm, FLEN_COMMENT,"beginning column of field %3d", ii + 1);
        ffkeyn("TBCOL", ii + 1, name, status);
        ffpkyj(fptr, name, tbcol[ii], comm, status);

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: ASCII table TFORM code is too long (ffphtb)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);
        ffkeyn("TFORM", ii + 1, name, status);
        ffpkys(fptr, name, tfmt, "Fortran-77 format of field", status);

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) )  /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii], "physical unit of field", status) ;
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this ASCII table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write ASCII table header keywords (ffphtb)");

    if (gotmem)
        free(tbcol); 

    return(*status);
}